

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O1

LY_ERR ly_out_new_clb(ly_write_clb writeclb,void *user_data,ly_out **out)

{
  ly_out *plVar1;
  char *pcVar2;
  
  if (out == (ly_out **)0x0) {
    pcVar2 = "out";
  }
  else {
    if (writeclb != (ly_write_clb)0x0) {
      plVar1 = (ly_out *)calloc(1,0x50);
      *out = plVar1;
      if (plVar1 != (ly_out *)0x0) {
        plVar1->type = LY_OUT_CALLBACK;
        (plVar1->method).clb.func = writeclb;
        (plVar1->method).clb.arg = user_data;
        return LY_SUCCESS;
      }
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_out_new_clb");
      return LY_EMEM;
    }
    pcVar2 = "writeclb";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_out_new_clb");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_out_new_clb(ly_write_clb writeclb, void *user_data, struct ly_out **out)
{
    LY_CHECK_ARG_RET(NULL, out, writeclb, LY_EINVAL);

    *out = calloc(1, sizeof **out);
    LY_CHECK_ERR_RET(!*out, LOGMEM(NULL), LY_EMEM);

    (*out)->type = LY_OUT_CALLBACK;
    (*out)->method.clb.func = writeclb;
    (*out)->method.clb.arg = user_data;

    return LY_SUCCESS;
}